

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_builder.c
# Opt level: O3

ChildDefinitions * get_child_definitions(AstNode *ast_node)

{
  _Bool _Var1;
  int iVar2;
  int iVar3;
  ItemQueue *item_queue;
  ItemQueue *item_queue_00;
  ChildDefinitions *pCVar4;
  ChildDefinition **ppCVar5;
  ChildDefinition *pCVar6;
  wchar_t wVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  
  item_queue = AstNode_get_items(ast_node,Rule_ScenarioDefinition);
  item_queue_00 = AstNode_get_items(ast_node,Rule_Rule);
  _Var1 = ItemQueue_is_empty(ast_node->item_queues + 0x14);
  if (_Var1) {
    pCVar6 = (ChildDefinition *)0x0;
  }
  else {
    pCVar6 = (ChildDefinition *)AstNode_get_single(ast_node,Rule_Background);
  }
  iVar2 = ItemQueue_size(item_queue);
  pCVar4 = (ChildDefinitions *)malloc(0x10);
  iVar8 = (iVar2 + 1) - (uint)(pCVar6 == (ChildDefinition *)0x0);
  iVar3 = ItemQueue_size(item_queue_00);
  wVar7 = iVar8 + iVar3;
  pCVar4->child_definition_count = wVar7;
  pCVar4->child_definitions = (ChildDefinition **)0x0;
  if (wVar7 != L'\0' && SCARRY4(iVar8,iVar3) == wVar7 < L'\0') {
    ppCVar5 = (ChildDefinition **)malloc((ulong)(uint)wVar7 * 8);
    pCVar4->child_definitions = ppCVar5;
    if (pCVar6 != (ChildDefinition *)0x0) {
      *ppCVar5 = pCVar6;
    }
    if (0 < iVar2) {
      uVar10 = (ulong)(pCVar6 != (ChildDefinition *)0x0);
      do {
        pCVar6 = (ChildDefinition *)ItemQueue_remove(item_queue);
        ppCVar5[uVar10] = pCVar6;
        uVar10 = uVar10 + 1;
      } while ((long)uVar10 < (long)iVar8);
    }
    if (0 < iVar3) {
      lVar9 = (long)iVar8;
      do {
        pCVar6 = (ChildDefinition *)ItemQueue_remove(item_queue_00);
        ppCVar5[lVar9] = pCVar6;
        lVar9 = lVar9 + 1;
      } while (lVar9 < (long)(ulong)(uint)wVar7);
    }
  }
  return pCVar4;
}

Assistant:

static const ChildDefinitions* get_child_definitions(AstNode* ast_node) {
    ItemQueue* scenario_definitions_queue = AstNode_get_items(ast_node, Rule_ScenarioDefinition);
    ItemQueue* rule_queue = AstNode_get_items(ast_node, Rule_Rule);
    const Background* background = get_background(ast_node);
    int background_count = background ? 1 : 0;
    int scenario_count = ItemQueue_size(scenario_definitions_queue);
    ChildDefinitions* child_definitions = (ChildDefinitions*)malloc(sizeof(ChildDefinitions));
    child_definitions->child_definition_count = background_count + scenario_count + ItemQueue_size(rule_queue);
    child_definitions->child_definitions = 0;
    if (child_definitions->child_definition_count > 0) {
        child_definitions->child_definitions = (ChildDefinition**)malloc(child_definitions->child_definition_count * sizeof(ChildDefinition*));
        int i;
        if (background) {
            child_definitions->child_definitions[0] = (ChildDefinition*)background;
        }
        for (i = background_count; i < background_count + scenario_count; ++i) {
            child_definitions->child_definitions[i] = (ChildDefinition*)ItemQueue_remove(scenario_definitions_queue);
        }
        for (i = background_count + scenario_count; i < child_definitions->child_definition_count; ++i) {
            child_definitions->child_definitions[i] = (ChildDefinition*)ItemQueue_remove(rule_queue);
        }
    }
    return child_definitions;
}